

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsTextItem::QGraphicsTextItem(QGraphicsTextItem *this,QGraphicsItem *parent)

{
  void *pvVar1;
  QGraphicsTextItemPrivate *this_00;
  QGraphicsObject *in_RSI;
  QGraphicsItemPrivate *in_RDI;
  QGraphicsItemPrivate *in_stack_ffffffffffffffe0;
  
  pvVar1 = operator_new(0x178);
  QGraphicsItemPrivate::QGraphicsItemPrivate(in_stack_ffffffffffffffe0);
  QGraphicsObject::QGraphicsObject(in_RSI,in_RDI,(QGraphicsItem *)in_stack_ffffffffffffffe0);
  in_RDI->_vptr_QGraphicsItemPrivate = (_func_int **)&PTR_metaObject_00d32eb8;
  (in_RDI->extras).d.ptr = (ExtraStruct *)&PTR__QGraphicsTextItem_00d33010;
  this_00 = (QGraphicsTextItemPrivate *)operator_new(0x38);
  QGraphicsTextItemPrivate::QGraphicsTextItemPrivate(this_00);
  (in_RDI->childrenBoundingRect).xp = (qreal)this_00;
  *(QGraphicsItemPrivate **)((long)(in_RDI->childrenBoundingRect).xp + 0x30) = in_RDI;
  QGraphicsItem::setAcceptDrops((QGraphicsItem *)this_00,SUB81((ulong)pvVar1 >> 0x38,0));
  QGraphicsItem::setAcceptHoverEvents((QGraphicsItem *)in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  QGraphicsItem::setFlag
            ((QGraphicsItem *)in_RDI,(GraphicsItemFlag)((ulong)this_00 >> 0x20),
             SUB81((ulong)this_00 >> 0x18,0));
  return;
}

Assistant:

QGraphicsTextItem::QGraphicsTextItem(QGraphicsItem *parent)
    : QGraphicsObject(*new QGraphicsItemPrivate, parent),
      dd(new QGraphicsTextItemPrivate)
{
    dd->qq = this;
    setAcceptDrops(true);
    setAcceptHoverEvents(true);
    setFlag(ItemUsesExtendedStyleOption);
}